

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range.cc
# Opt level: O1

Range * re2c::Range::sub(Range *r1,Range *r2)

{
  uint32_t *puVar1;
  uint uVar2;
  Range *pRVar3;
  Range *pRVar4;
  uint uVar5;
  Range **tail;
  Range *head;
  Range *local_20;
  
  local_20 = (Range *)0x0;
  if (r1 != (Range *)0x0) {
    pRVar4 = (Range *)&local_20;
    do {
      if ((r2 == (Range *)0x0) || (uVar2 = r2->lb, r1->ub <= uVar2)) {
        pRVar3 = ran(r1->lb,r1->ub);
        pRVar4->nx = pRVar3;
        pRVar4 = pRVar3;
LAB_00147fc8:
        r1 = r1->nx;
      }
      else {
        uVar5 = r1->lb;
        if (uVar5 < r2->ub) {
          pRVar3 = pRVar4;
          if (uVar5 < uVar2) {
            pRVar3 = ran(uVar5,uVar2);
            pRVar4->nx = pRVar3;
          }
          do {
            puVar1 = &r2->ub;
            uVar2 = r1->ub;
            pRVar4 = pRVar3;
            if (uVar2 <= *puVar1) break;
            r2 = r2->nx;
            if ((r2 == (Range *)0x0) || (uVar5 = r2->lb, uVar2 <= r2->lb)) {
              uVar5 = uVar2;
            }
            pRVar4 = ran(*puVar1,uVar5);
            pRVar3->nx = pRVar4;
            pRVar3 = pRVar4;
          } while (r2 != (Range *)0x0);
          goto LAB_00147fc8;
        }
        r2 = r2->nx;
      }
    } while (r1 != (Range *)0x0);
  }
  return local_20;
}

Assistant:

Range * Range::sub (const Range * r1, const Range * r2)
{
	Range * head = NULL;
	Range ** ptail = &head;
	while (r1)
	{
		if (!r2 || r2->lb >= r1->ub)
		{
			append (ptail, r1->lb, r1->ub);
			r1 = r1->nx;
		}
		else if (r2->ub <= r1->lb)
		{
			r2 = r2->nx;
		}
		else
		{
			if (r1->lb < r2->lb)
			{
				append (ptail, r1->lb, r2->lb);
			}
			while (r2 && r2->ub < r1->ub)
			{
				const uint32_t lb = r2->ub;
				r2 = r2->nx;
				const uint32_t ub = r2 && r2->lb < r1->ub
					? r2->lb
					: r1->ub;
				append (ptail, lb, ub);
			}
			r1 = r1->nx;
		}
	}
	return head;
}